

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O1

void prvTidyDefinePriorityAttribute(TidyDocImpl *doc,ctmbstr name)

{
  uint uVar1;
  tmbstr *pptVar2;
  tmbstr ptVar3;
  
  if ((doc->attribs).priorityAttribs.list == (tmbstr *)0x0) {
    pptVar2 = (tmbstr *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x50);
    (doc->attribs).priorityAttribs.list = pptVar2;
    *pptVar2 = (tmbstr)0x0;
    (doc->attribs).priorityAttribs.count = 0;
    (doc->attribs).priorityAttribs.capacity = 10;
  }
  uVar1 = (doc->attribs).priorityAttribs.capacity;
  if (uVar1 <= (doc->attribs).priorityAttribs.count) {
    uVar1 = uVar1 * 2;
    (doc->attribs).priorityAttribs.capacity = uVar1;
    pptVar2 = (tmbstr *)
              (*doc->allocator->vtbl->realloc)
                        (doc->allocator,(doc->attribs).priorityAttribs.list,(ulong)uVar1 * 8 + 1);
    (doc->attribs).priorityAttribs.list = pptVar2;
  }
  ptVar3 = prvTidytmbstrdup(doc->allocator,name);
  uVar1 = (doc->attribs).priorityAttribs.count;
  (doc->attribs).priorityAttribs.list[uVar1] = ptVar3;
  uVar1 = uVar1 + 1;
  (doc->attribs).priorityAttribs.count = uVar1;
  (doc->attribs).priorityAttribs.list[uVar1] = (tmbstr)0x0;
  return;
}

Assistant:

void TY_(DefinePriorityAttribute)(TidyDocImpl* doc, ctmbstr name)
{
    enum { capacity = 10 };
    PriorityAttribs *priorities = &(doc->attribs.priorityAttribs);

    if ( !priorities->list )
    {
        priorities->list = TidyAlloc(doc->allocator, sizeof(ctmbstr) * capacity );
        priorities->list[0] = NULL;
        priorities->capacity = capacity;
        priorities->count = 0;
    }

    if ( priorities->count >= priorities->capacity )
    {
        priorities->capacity = priorities->capacity * 2;
        priorities->list = TidyRealloc(doc->allocator, priorities->list, sizeof(tmbstr) * priorities->capacity + 1 );
    }

    priorities->list[priorities->count] = TY_(tmbstrdup)( doc->allocator, name);
    priorities->count++;
    priorities->list[priorities->count] = NULL;
}